

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQBool sqstd_rex_searchrange
                 (SQRex *exp,SQChar *text_begin,SQChar *text_end,SQChar **out_begin,SQChar **out_end
                 )

{
  SQChar *pSVar1;
  SQBool SVar2;
  SQChar *pSVar3;
  long lVar4;
  SQChar *pSVar5;
  
  if (text_end <= text_begin) {
    return 0;
  }
  lVar4 = exp->_first;
  exp->_bol = text_begin;
  exp->_eol = text_end;
  pSVar1 = text_begin;
LAB_00107f48:
  do {
    pSVar5 = pSVar1;
    pSVar3 = text_begin;
    if (lVar4 != -1) {
      exp->_currsubexp = 0;
      text_begin = sqstd_rex_matchnode(exp,exp->_nodes + lVar4,text_begin,(SQRexNode *)0x0);
      pSVar3 = (SQChar *)0x0;
      if (text_begin != (SQChar *)0x0) {
        lVar4 = exp->_nodes[lVar4].next;
        pSVar1 = pSVar5;
        goto LAB_00107f48;
      }
    }
    if ((pSVar3 != (SQChar *)0x0) ||
       (text_begin = pSVar5 + 1, pSVar1 = text_begin, text_begin == text_end)) {
      if (pSVar3 == (SQChar *)0x0) {
        SVar2 = 0;
      }
      else {
        if (out_begin != (SQChar **)0x0) {
          *out_begin = pSVar5;
        }
        SVar2 = 1;
        if (out_end != (SQChar **)0x0) {
          *out_end = pSVar3;
        }
      }
      return SVar2;
    }
  } while( true );
}

Assistant:

SQBool sqstd_rex_searchrange(SQRex* exp,const SQChar* text_begin,const SQChar* text_end,const SQChar** out_begin, const SQChar** out_end)
{
    const SQChar *cur = NULL;
    SQInteger node = exp->_first;
    if(text_begin >= text_end) return SQFalse;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
        cur = text_begin;
        while(node != -1) {
            exp->_currsubexp = 0;
            cur = sqstd_rex_matchnode(exp,&exp->_nodes[node],cur,NULL);
            if(!cur)
                break;
            node = exp->_nodes[node].next;
        }
        text_begin++;
    } while(cur == NULL && text_begin != text_end);

    if(cur == NULL)
        return SQFalse;

    --text_begin;

    if(out_begin) *out_begin = text_begin;
    if(out_end) *out_end = cur;
    return SQTrue;
}